

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O0

GCtab * newtab(lua_State *L,uint32_t asize,uint32_t hbits)

{
  int iVar1;
  GCtab *p;
  void *pvVar2;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  Node *nilnode_1;
  Node *nilnode;
  GCtab *t;
  Node *node;
  uint32_t hsize;
  long in_stack_ffffffffffffffb8;
  lua_State *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  GCSize size;
  GCtab *pGVar3;
  
  size = (GCSize)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  if ((in_ESI == 0) || (0x10 < in_ESI)) {
    p = (GCtab *)lj_mem_newgco((lua_State *)CONCAT44(in_ESI,in_EDX),size);
    p->gct = '\v';
    p->nomm = 0xff;
    p->colo = '\0';
    (p->array).ptr32 = 0;
    (p->metatable).gcptr32 = 0;
    p->asize = 0;
    p->hmask = 0;
    in_stack_ffffffffffffffb8 = (ulong)*(uint *)(in_RDI + 8) + 0x130;
    (p->node).ptr32 = (uint32_t)in_stack_ffffffffffffffb8;
    if (in_ESI != 0) {
      if (0x8000001 < in_ESI) {
        lj_err_msg(in_stack_ffffffffffffffc0,(ErrMsg)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
      }
      pvVar2 = lj_mem_realloc((lua_State *)CONCAT44(in_ESI,in_EDX),p,
                              (GCSize)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                              (GCSize)in_stack_ffffffffffffffc0);
      (p->array).ptr32 = (uint32_t)pvVar2;
      p->asize = in_ESI;
    }
  }
  else {
    p = (GCtab *)lj_mem_newgco((lua_State *)CONCAT44(in_ESI,in_EDX),size);
    p->gct = '\v';
    p->nomm = 0xff;
    p->colo = (int8_t)in_ESI;
    (p->array).ptr32 = (int)p + 0x20;
    (p->metatable).gcptr32 = 0;
    p->asize = in_ESI;
    p->hmask = 0;
    in_stack_ffffffffffffffc0 = (lua_State *)((ulong)*(uint *)(in_RDI + 8) + 0x130);
    (p->node).ptr32 = (uint32_t)in_stack_ffffffffffffffc0;
  }
  pGVar3 = p;
  if (in_EDX != 0) {
    if (0x1a < in_EDX) {
      lj_err_msg(in_stack_ffffffffffffffc0,(ErrMsg)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    }
    iVar1 = 1 << ((byte)in_EDX & 0x1f);
    pvVar2 = lj_mem_realloc((lua_State *)CONCAT44(in_ESI,in_EDX),p,
                            (GCSize)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                            (GCSize)in_stack_ffffffffffffffc0);
    (p->node).ptr32 = (uint32_t)pvVar2;
    *(uint32_t *)((long)pvVar2 + 0x14) = (uint32_t)pvVar2 + iVar1 * 0x18;
    p->hmask = iVar1 - 1;
  }
  *(long *)((ulong)*(uint *)(in_RDI + 8) + 0xd0) =
       *(long *)((ulong)*(uint *)(in_RDI + 8) + 0xd0) + 1;
  return pGVar3;
}

Assistant:

static GCtab *newtab(lua_State *L, uint32_t asize, uint32_t hbits)
{
  GCtab *t;
  /* First try to colocate the array part. */
  if (LJ_MAX_COLOSIZE != 0 && asize > 0 && asize <= LJ_MAX_COLOSIZE) {
    Node *nilnode;
    lj_assertL((sizeof(GCtab) & 7) == 0, "bad GCtab size");
    t = (GCtab *)lj_mem_newgco(L, sizetabcolo(asize));
    t->gct = ~LJ_TTAB;
    t->nomm = (uint8_t)~0;
    t->colo = (int8_t)asize;
    setmref(t->array, (TValue *)((char *)t + sizeof(GCtab)));
    setgcrefnull(t->metatable);
    t->asize = asize;
    t->hmask = 0;
    nilnode = &G(L)->nilnode;
    setmref(t->node, nilnode);
#if LJ_GC64
    setmref(t->freetop, nilnode);
#endif
  } else {  /* Otherwise separately allocate the array part. */
    Node *nilnode;
    t = lj_mem_newobj(L, GCtab);
    t->gct = ~LJ_TTAB;
    t->nomm = (uint8_t)~0;
    t->colo = 0;
    setmref(t->array, NULL);
    setgcrefnull(t->metatable);
    t->asize = 0;  /* In case the array allocation fails. */
    t->hmask = 0;
    nilnode = &G(L)->nilnode;
    setmref(t->node, nilnode);
#if LJ_GC64
    setmref(t->freetop, nilnode);
#endif
    if (asize > 0) {
      if (asize > LJ_MAX_ASIZE)
	lj_err_msg(L, LJ_ERR_TABOV);
      setmref(t->array, lj_mem_newvec(L, asize, TValue));
      t->asize = asize;
    }
  }
  if (hbits)
    newhpart(L, t, hbits);
  G(L)->gc.tabnum++;
  return t;
}